

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::apply_settings_pack_impl
          (session_impl *this,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack)

{
  session_settings *this_00;
  pointer psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  string *psVar7;
  char *pcVar8;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->m_settings;
  bVar2 = settings_pack::has_val((settings_pack *)pack,5);
  if (bVar2) {
    psVar7 = settings_pack::get_str_abi_cxx11_((settings_pack *)pack,5);
    ::std::__cxx11::string::string((string *)&local_70,(string *)psVar7);
    psVar7 = session_settings::get_str_abi_cxx11_(this_00,5);
    ::std::__cxx11::string::string((string *)&local_50,(string *)psVar7);
    bVar2 = ::std::operator!=(&local_70,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    bVar3 = true;
    if (bVar2) goto LAB_0028afb7;
  }
  bVar2 = settings_pack::has_val((settings_pack *)pack,0x407b);
  if (bVar2) {
    iVar5 = settings_pack::get_int((settings_pack *)pack,0x407b);
    iVar6 = session_settings::get_int(this_00,0x407b);
    bVar3 = true;
    if (iVar5 != iVar6) goto LAB_0028afb7;
  }
  bVar3 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x8041);
LAB_0028afb7:
  bVar2 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x802a);
  bVar4 = true;
  if (!bVar2) {
    bVar2 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x8022);
    if (!bVar2) {
      bVar4 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x8020);
    }
  }
  pcVar8 = "false";
  if (bVar3 != false) {
    pcVar8 = "true";
  }
  session_log(this,"applying settings pack, reopen_listen_port=%s",pcVar8);
  apply_pack((settings_pack *)pack,this_00,this);
  validate_settings(this);
  (*((this->m_disk_thread)._M_t.
     super___uniq_ptr_impl<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
     ._M_t.
     super__Tuple_impl<0UL,_libtorrent::disk_interface_*,_std::default_delete<libtorrent::disk_interface>_>
     .super__Head_base<0UL,_libtorrent::disk_interface_*,_false>._M_head_impl)->_vptr_disk_interface
    [0x12])();
  if (bVar3 == false) {
    update_listen_interfaces(this);
  }
  else {
    reopen_listen_sockets(this,true);
  }
  if (bVar4 != false) {
    psVar1 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar9 = (this->m_torrents).m_array.
                  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar1; psVar9 = psVar9 + 1)
    {
      torrent::update_want_peers
                ((psVar9->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    }
  }
  return;
}

Assistant:

void session_impl::apply_settings_pack_impl(settings_pack const& pack)
	{
		bool const reopen_listen_port
			= setting_changed<std::string>(pack, m_settings, settings_pack::listen_interfaces)
			|| setting_changed<int>(pack, m_settings, settings_pack::proxy_type)
			|| setting_changed<bool>(pack, m_settings, settings_pack::proxy_peer_connections)
#if TORRENT_ABI_VERSION == 1
			|| setting_changed<int>(pack, m_settings, settings_pack::ssl_listen)
#endif
			;

		bool const update_want_peers
			= setting_changed<bool>(pack, m_settings, settings_pack::seeding_outgoing_connections)
			|| setting_changed<bool>(pack, m_settings, settings_pack::enable_outgoing_tcp)
			|| setting_changed<bool>(pack, m_settings, settings_pack::enable_outgoing_utp)
		;

#ifndef TORRENT_DISABLE_LOGGING
		session_log("applying settings pack, reopen_listen_port=%s"
			, reopen_listen_port ? "true" : "false");
#endif

		apply_pack(&pack, m_settings, this);

#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		validate_settings();
#endif

		m_disk_thread->settings_updated();

		if (!reopen_listen_port)
		{
			// no need to call this if reopen_listen_port is true
			// since the apply_pack will do it
			update_listen_interfaces();
		}
		else
		{
			reopen_listen_sockets();
		}

		if (update_want_peers)
		{
			for (auto const& t : m_torrents)
				t->update_want_peers();
		}
	}